

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

void recall_tree_ns::learn(recall_tree *b,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  uint64_t *puVar2;
  float fVar3;
  node_pred *pnVar4;
  bool bVar5;
  predict_type pVar6;
  node_pred *pnVar7;
  node *pnVar8;
  node_pred *pnVar9;
  uint32_t uVar10;
  uint uVar11;
  ulong uVar12;
  uint cn;
  int iVar13;
  float fVar14;
  float fVar15;
  
  pVar6 = predict_from(b,base,ec,0);
  (ec->pred).multiclass = pVar6.class_prediction;
  if (b->all->training != true) {
    return;
  }
  if ((ec->l).multi.label == 0xffffffff) {
    return;
  }
  uVar12 = 0;
  do {
    uVar10 = (uint32_t)uVar12;
    if ((b->nodes)._begin[uVar12].internal != true) break;
    fVar14 = train_node(b,base,ec,uVar10);
    if (b->randomized_routing == true) {
      fVar15 = merand48(&b->all->random_state);
      fVar14 = (fVar14 + fVar14 + 1.0) * 0.5;
      if (1.0 <= fVar14) {
        fVar14 = 1.0;
      }
      if (fVar14 <= 0.0) {
        fVar14 = 0.0;
      }
      fVar14 = *(float *)(&DAT_00277838 + (ulong)(fVar14 < fVar15) * 4);
    }
    pnVar8 = (b->nodes)._begin;
    uVar11 = (&pnVar8[uVar12].left)[0.0 <= fVar14];
    fVar14 = b->bern_hyper;
    cn = uVar10;
    if (0.0 < fVar14) {
      fVar15 = pnVar8[uVar12].recall_lbest;
      fVar3 = pnVar8[uVar11].recall_lbest;
      insert_example_at_node(b,uVar10,ec);
      bVar5 = true;
      uVar12 = (ulong)uVar11;
      cn = uVar11;
      uVar11 = uVar10;
      if (fVar3 <= fVar15) goto LAB_001cfcd0;
    }
    else {
LAB_001cfcd0:
      insert_example_at_node(b,cn,ec);
      uVar12 = (ulong)uVar11;
      bVar5 = fVar14 <= 0.0;
    }
  } while (bVar5);
  if ((b->nodes)._begin[uVar12].internal == false) {
    insert_example_at_node(b,(uint32_t)uVar12,ec);
  }
  pnVar8 = (b->nodes)._begin;
  pnVar7 = pnVar8[uVar12].preds._begin;
  pnVar4 = pnVar8[uVar12].preds._end;
  if (pnVar7 == pnVar4) {
    return;
  }
  pnVar9 = pnVar7 + b->max_candidates;
  while( true ) {
    if (pnVar9 <= pnVar7) {
      return;
    }
    if (pnVar7->label == (ec->l).multi.label) break;
    pnVar7 = pnVar7 + 1;
    if (pnVar7 == pnVar4) {
      return;
    }
  }
  uVar10 = (ec->l).multi.label;
  fVar14 = (ec->l).simple.weight;
  fVar15 = (ec->pred).scalar;
  add_node_id_feature(b,(uint32_t)uVar12,ec);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
  (ec->l).simple.initial = 0.0;
  iVar13 = (int)b->max_routers + uVar10 + -1;
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar13);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 - (ulong)(uint)(iVar13 * *(int *)(base + 0xe0));
  (ec->l).cs.costs._begin = (wclass *)0x3f800000bf800000;
  (ec->l).simple.initial = 0.0;
  pnVar8 = (b->nodes)._begin;
  pnVar7 = pnVar8[uVar12].preds._begin;
  if (pnVar7 != pnVar8[uVar12].preds._end) {
    pnVar8 = pnVar8 + uVar12;
    do {
      if ((pnVar8->preds)._begin + b->max_candidates <= pnVar7) break;
      if (pnVar7->label != uVar10) {
        iVar13 = pnVar7->label + (int)b->max_routers + -1;
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar13);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 - (ulong)(uint)(iVar13 * *(int *)(base + 0xe0));
      }
      pnVar7 = pnVar7 + 1;
      pnVar8 = (b->nodes)._begin + uVar12;
    } while (pnVar7 != (pnVar8->preds)._end);
  }
  features::clear((ec->super_example_predict).feature_space + 0x88);
  ppuVar1 = &(ec->super_example_predict).indices._end;
  *ppuVar1 = *ppuVar1 + -1;
  (ec->l).multi.label = uVar10;
  (ec->l).simple.weight = fVar14;
  (ec->pred).scalar = fVar15;
  return;
}

Assistant:

void learn(recall_tree& b, single_learner& base, example& ec)
{
  predict(b, base, ec);

  if (b.all->training && ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    uint32_t cn = 0;

    while (b.nodes[cn].internal)
    {
      float which = train_node(b, base, ec, cn);

      if (b.randomized_routing)
        which = (merand48(b.all->random_state) > to_prob(which) ? -1.f : 1.f);

      uint32_t newcn = descend(b.nodes[cn], which);
      bool cond = stop_recurse_check(b, cn, newcn);
      insert_example_at_node(b, cn, ec);

      if (cond)
      {
        insert_example_at_node(b, newcn, ec);
        break;
      }

      cn = newcn;
    }

    if (!b.nodes[cn].internal)
      insert_example_at_node(b, cn, ec);

    if (is_candidate(b, cn, ec))
    {
      MULTICLASS::label_t mc = ec.l.multi;
      uint32_t save_pred = ec.pred.multiclass;

      add_node_id_feature(b, cn, ec);

      ec.l.simple = {1.f, 1.f, 0.f};
      base.learn(ec, b.max_routers + mc.label - 1);
      ec.l.simple = {-1.f, 1.f, 0.f};

      for (node_pred* ls = b.nodes[cn].preds.begin();
           ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
      {
        if (ls->label != mc.label)
          base.learn(ec, b.max_routers + ls->label - 1);
      }

      remove_node_id_feature(b, cn, ec);

      ec.l.multi = mc;
      ec.pred.multiclass = save_pred;
    }
  }
}